

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

void __thiscall UniValue::pushKVs(UniValue *this,UniValue *obj)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  size_t i;
  UniValue *in_stack_ffffffffffffff18;
  UniValue *in_stack_ffffffffffffff20;
  UniValue *in_stack_ffffffffffffff28;
  reference in_stack_ffffffffffffff30;
  VType *in_stack_ffffffffffffff58;
  UniValue *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  UniValue local_80;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  checkType(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  checkType(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    pbVar2 = this_00;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_ffffffffffffff18);
    if (pbVar1 <= this_00) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_ffffffffffffff28,(size_type)in_stack_ffffffffffffff20);
    std::__cxx11::string::string
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff30 =
         std::vector<UniValue,_std::allocator<UniValue>_>::at
                   ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffff28,
                    (size_type)in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff28 = &local_80;
    UniValue(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    pushKVEnd(in_RDI,this_00,in_stack_ffffffffffffff30);
    ~UniValue(in_stack_ffffffffffffff18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff18);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&(pbVar2->_M_dataplus)._M_p + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::pushKVs(UniValue obj)
{
    checkType(VOBJ);
    obj.checkType(VOBJ);

    for (size_t i = 0; i < obj.keys.size(); i++)
        pushKVEnd(std::move(obj.keys.at(i)), std::move(obj.values.at(i)));
}